

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

int __thiscall libsgp4::DateTime::DayOfYear(DateTime *this,int year,int month,int day)

{
  bool bVar1;
  int local_20;
  int daysThisYear;
  int day_local;
  int month_local;
  int year_local;
  DateTime *this_local;
  
  bVar1 = IsValidYearMonthDay(year,month,day);
  if (!bVar1) {
    __assert_fail("false && \"Invalid year, month and day\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dnwrnr[P]sgp4/libsgp4/DateTime.h"
                  ,0x123,"int libsgp4::DateTime::DayOfYear(int, int, int) const");
  }
  bVar1 = IsLeapYear(year);
  if (bVar1) {
    local_20 = *(int *)((anonymous_namespace)::cumulDaysInMonth + (long)month * 4 + 0x34);
  }
  else {
    local_20 = *(int *)((anonymous_namespace)::cumulDaysInMonth + (long)month * 4);
  }
  local_20 = local_20 + day;
  return local_20;
}

Assistant:

int DayOfYear(int year, int month, int day) const
    {
        if (!IsValidYearMonthDay(year, month, day))
        {
            assert(false && "Invalid year, month and day");
        }

        int daysThisYear = day;

        if (IsLeapYear(year))
        {
            daysThisYear += cumulDaysInMonth[1][month];
        }
        else
        {
            daysThisYear += cumulDaysInMonth[0][month];
        }

        return daysThisYear;
    }